

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::RuleBasedNumberFormat::format
          (RuleBasedNumberFormat *this,int64_t number,UnicodeString *ruleSetName,
          UnicodeString *toAppendTo,FieldPosition *param_4,UErrorCode *status)

{
  short sVar1;
  int32_t iVar2;
  NFRuleSet *ruleSet;
  uint start;
  uint uVar3;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    sVar1 = (ruleSetName->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      uVar3 = (ruleSetName->fUnion).fFields.fLength;
    }
    else {
      uVar3 = (int)sVar1 >> 5;
    }
    start = (int)uVar3 >> 0x1f & uVar3;
    iVar2 = UnicodeString::indexOf(ruleSetName,L"%%",0,2,start,uVar3 - start);
    if (iVar2 == 0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      ruleSet = findRuleSet(this,ruleSetName,status);
      if (ruleSet != (NFRuleSet *)0x0) {
        format(this,number,ruleSet,toAppendTo,status);
      }
    }
  }
  return toAppendTo;
}

Assistant:

UnicodeString&
RuleBasedNumberFormat::format(int64_t number,
                              const UnicodeString& ruleSetName,
                              UnicodeString& toAppendTo,
                              FieldPosition& /* pos */,
                              UErrorCode& status) const
{
    if (U_SUCCESS(status)) {
        if (ruleSetName.indexOf(gPercentPercent, 2, 0) == 0) {
            // throw new IllegalArgumentException("Can't use internal rule set");
            status = U_ILLEGAL_ARGUMENT_ERROR;
        } else {
            NFRuleSet *rs = findRuleSet(ruleSetName, status);
            if (rs) {
                format(number, rs, toAppendTo, status);
            }
        }
    }
    return toAppendTo;
}